

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

void __thiscall CLOptions::PrintHelp(CLOptions *this,string *executable_name)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  long lVar3;
  undefined8 uVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  CLOptions *pCVar8;
  undefined1 local_70 [32];
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  pp_Var1 = (_func_int **)(local_70 + 0x10);
  pcVar2 = (this->version_opt).
           super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .parameter_name._M_dataplus._M_p;
  local_70._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,
             pcVar2 + (this->version_opt).
                      super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .parameter_name._M_string_length);
  uVar4 = local_70._8_8_;
  if ((_func_int **)local_70._0_8_ != pp_Var1) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    pcVar2 = (this->version_opt).
             super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .value._M_dataplus._M_p;
    local_70._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,
               pcVar2 + (this->version_opt).
                        super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .value._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_70._0_8_,local_70._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((_func_int **)local_70._0_8_ != pp_Var1) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nUSAGE: ",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(executable_name->_M_dataplus)._M_p,
                      executable_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," [options]",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((this->program_desc_)._M_string_length != 0) {
    pCVar8 = (CLOptions *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nDESCRIPTION:\n",0xe)
    ;
    PrintDescription(pCVar8,&this->program_desc_,2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nAVAILABLE OPTIONS:",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  puts("  -h, --help [no argument]");
  pCVar8 = (CLOptions *)local_70;
  local_70._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pCVar8,"Prints out this help information.","");
  PrintDescription(pCVar8,(string *)local_70,0xf);
  if ((_func_int **)local_70._0_8_ != pp_Var1) {
    operator_delete((void *)local_70._0_8_);
  }
  pcVar2 = (this->version_opt).
           super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .parameter_name._M_dataplus._M_p;
  local_70._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,
             pcVar2 + (this->version_opt).
                      super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .parameter_name._M_string_length);
  if ((_func_int **)local_70._0_8_ != pp_Var1) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((pointer)local_70._8_8_ != (pointer)0x0) {
    pcVar2 = (this->version_opt).
             super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .parameter_name._M_dataplus._M_p;
    local_70._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,
               pcVar2 + (this->version_opt).
                        super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .parameter_name._M_string_length);
    printf("  -v, --%s [no argument]\n",local_70._0_8_);
    if ((_func_int **)local_70._0_8_ != pp_Var1) {
      operator_delete((void *)local_70._0_8_);
    }
    pcVar2 = (this->version_opt).
             super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .description._M_dataplus._M_p;
    pCVar8 = (CLOptions *)local_70;
    local_70._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,
               pcVar2 + (this->version_opt).
                        super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .description._M_string_length);
    PrintDescription(pCVar8,(string *)local_70,0xf);
    if ((_func_int **)local_70._0_8_ != pp_Var1) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  p_Var6 = (this->params_bools)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->params_bools)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var7) {
    do {
      CLParam<bool>::getFullParamName_abi_cxx11_((string *)local_70,*(CLParam<bool> **)(p_Var6 + 2))
      ;
      printf("  -%s [bool, default=%d]\n",local_70._0_8_,
             (ulong)*(byte *)(*(long *)(p_Var6 + 2) + 0x51));
      if ((_func_int **)local_70._0_8_ != pp_Var1) {
        operator_delete((void *)local_70._0_8_);
      }
      lVar3 = *(long *)(*(long *)(p_Var6 + 2) + 0x30);
      pCVar8 = (CLOptions *)local_70;
      local_70._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,lVar3,*(long *)(*(long *)(p_Var6 + 2) + 0x38) + lVar3);
      PrintDescription(pCVar8,(string *)local_70,0xf);
      if ((_func_int **)local_70._0_8_ != pp_Var1) {
        operator_delete((void *)local_70._0_8_);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var7);
  }
  p_Var6 = (this->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->params_doubles)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var7) {
    do {
      CLParam<double>::getFullParamName_abi_cxx11_
                ((string *)local_70,*(CLParam<double> **)(p_Var6 + 2));
      printf("  -%s [double, default=%f]\n",*(undefined8 *)(*(long *)(p_Var6 + 2) + 0x58),
             local_70._0_8_);
      if ((_func_int **)local_70._0_8_ != pp_Var1) {
        operator_delete((void *)local_70._0_8_);
      }
      lVar3 = *(long *)(*(long *)(p_Var6 + 2) + 0x30);
      pCVar8 = (CLOptions *)local_70;
      local_70._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,lVar3,*(long *)(*(long *)(p_Var6 + 2) + 0x38) + lVar3);
      PrintDescription(pCVar8,(string *)local_70,0xf);
      if ((_func_int **)local_70._0_8_ != pp_Var1) {
        operator_delete((void *)local_70._0_8_);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var7);
  }
  p_Var6 = (this->params_ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->params_ints)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var7) {
    do {
      CLParam<int>::getFullParamName_abi_cxx11_((string *)local_70,*(CLParam<int> **)(p_Var6 + 2));
      printf("  -%s [int, default=%d]\n",local_70._0_8_,
             (ulong)*(uint *)(*(long *)(p_Var6 + 2) + 0x54));
      if ((_func_int **)local_70._0_8_ != pp_Var1) {
        operator_delete((void *)local_70._0_8_);
      }
      lVar3 = *(long *)(*(long *)(p_Var6 + 2) + 0x30);
      pCVar8 = (CLOptions *)local_70;
      local_70._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,lVar3,*(long *)(*(long *)(p_Var6 + 2) + 0x38) + lVar3);
      PrintDescription(pCVar8,(string *)local_70,0xf);
      if ((_func_int **)local_70._0_8_ != pp_Var1) {
        operator_delete((void *)local_70._0_8_);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var7);
  }
  p_Var6 = (this->params_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->params_strings)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var7) {
    do {
      CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      getFullParamName((string *)local_70,
                       *(CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         **)(p_Var6 + 2));
      uVar4 = local_70._0_8_;
      lVar3 = *(long *)(*(long *)(p_Var6 + 2) + 0x70);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar3,*(long *)(*(long *)(p_Var6 + 2) + 0x78) + lVar3);
      printf("  -%s [string, default=%s]\n",uVar4,local_50);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if ((_func_int **)local_70._0_8_ != pp_Var1) {
        operator_delete((void *)local_70._0_8_);
      }
      lVar3 = *(long *)(*(long *)(p_Var6 + 2) + 0x30);
      pCVar8 = (CLOptions *)local_70;
      local_70._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,lVar3,*(long *)(*(long *)(p_Var6 + 2) + 0x38) + lVar3);
      PrintDescription(pCVar8,(string *)local_70,0xf);
      if ((_func_int **)local_70._0_8_ != pp_Var1) {
        operator_delete((void *)local_70._0_8_);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var7);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

void CLOptions::PrintHelp(const std::string& executable_name)
{
    // Print version if available
    if (!version_opt.getParamName().empty()) {
        std::cout << version_opt.getValue() << std::endl;
    }

    // Print usage information
    std::cout << "\nUSAGE: " << executable_name << " [options]" << std::endl;
    
    // Print the descripton of the program
    if (!program_desc_.empty()) {
        std::cout << "\nDESCRIPTION:\n" ;
        PrintDescription(program_desc_, 2) ;
    }
    
    std::cout << "\nAVAILABLE OPTIONS:" << std::endl;
    
    // Specify the help information
    std::printf("  -h, --help [no argument]\n") ;
    PrintDescription("Prints out this help information.") ;
    
    // Specify the version information
    if (!version_opt.getParamName().empty()) {
        std::printf("  -v, --%s [no argument]\n", version_opt.getParamName().c_str()) ;
        PrintDescription(version_opt.getDescription()) ;
    }
    
    // Loop through the parameters and print their current values
    
    // BOOLEANS
    std::map<std::string, CLBool*>::iterator bool_itr ;
    for (bool_itr=params_bools.begin(); bool_itr!=params_bools.end(); ++bool_itr) {
        std::printf("  -%s [bool, default=%d]\n",
                    bool_itr->second->getFullParamName().c_str(),
                    bool_itr->second->getDefault()) ;
        PrintDescription(bool_itr->second->getDescription()) ;
    }
    // DOUBLES
    std::map<std::string, CLDouble*>::iterator dbl_itr ;
    for (dbl_itr=params_doubles.begin(); dbl_itr!=params_doubles.end(); ++dbl_itr) {
        std::printf("  -%s [double, default=%f]\n",
                    dbl_itr->second->getFullParamName().c_str(),
                    dbl_itr->second->getDefault()) ;
        PrintDescription(dbl_itr->second->getDescription()) ;
    }
    // INTEGERS
    std::map<std::string, CLInt*>::iterator int_itr ;
    for (int_itr=params_ints.begin(); int_itr!=params_ints.end(); ++int_itr) {
        std::printf("  -%s [int, default=%d]\n",
                    int_itr->second->getFullParamName().c_str(),
                    int_itr->second->getDefault()) ;
        PrintDescription(int_itr->second->getDescription()) ;
    }
    // STRINGS
    std::map<std::string, CLString*>::iterator str_itr ;
    for (str_itr=params_strings.begin(); str_itr!=params_strings.end(); ++str_itr) {
        std::printf("  -%s [string, default=%s]\n",
                    str_itr->second->getFullParamName().c_str(),
                    str_itr->second->getDefault().c_str()) ;
        PrintDescription(str_itr->second->getDescription()) ;
    }
    std::cout << std::endl;
}